

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_channel
ma_channel_map_init_standard_channel
          (ma_standard_channel_map standardChannelMap,ma_uint32 channelCount,ma_uint32 channelIndex)

{
  uint in_EDX;
  ma_uint32 in_ESI;
  undefined4 in_EDI;
  ma_channel local_1;
  
  if ((in_ESI == 0) || (in_ESI <= in_EDX)) {
    local_1 = '\0';
  }
  else {
    switch(in_EDI) {
    case 0:
    default:
      local_1 = ma_channel_map_init_standard_channel_microsoft(in_ESI,in_EDX);
      break;
    case 1:
      local_1 = ma_channel_map_init_standard_channel_alsa(in_ESI,in_EDX);
      break;
    case 2:
      local_1 = ma_channel_map_init_standard_channel_rfc3551(in_ESI,in_EDX);
      break;
    case 3:
      local_1 = ma_channel_map_init_standard_channel_flac(in_ESI,in_EDX);
      break;
    case 4:
      local_1 = ma_channel_map_init_standard_channel_vorbis(in_ESI,in_EDX);
      break;
    case 5:
      local_1 = ma_channel_map_init_standard_channel_sound4(in_ESI,in_EDX);
      break;
    case 6:
      local_1 = ma_channel_map_init_standard_channel_sndio(in_ESI,in_EDX);
    }
  }
  return local_1;
}

Assistant:

static ma_channel ma_channel_map_init_standard_channel(ma_standard_channel_map standardChannelMap, ma_uint32 channelCount, ma_uint32 channelIndex)
{
    if (channelCount == 0 || channelIndex >= channelCount) {
        return MA_CHANNEL_NONE;
    }

    switch (standardChannelMap)
    {
        case ma_standard_channel_map_alsa:
        {
            return ma_channel_map_init_standard_channel_alsa(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_rfc3551:
        {
            return ma_channel_map_init_standard_channel_rfc3551(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_flac:
        {
            return ma_channel_map_init_standard_channel_flac(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_vorbis:
        {
            return ma_channel_map_init_standard_channel_vorbis(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_sound4:
        {
            return ma_channel_map_init_standard_channel_sound4(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_sndio:
        {
            return ma_channel_map_init_standard_channel_sndio(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_microsoft: /* Also default. */
        /*case ma_standard_channel_map_default;*/
        default:
        {
            return ma_channel_map_init_standard_channel_microsoft(channelCount, channelIndex);
        } break;
    }
}